

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CGL::Application::initialize_style(Application *this)

{
  long in_RDI;
  Color local_98;
  Color local_8c;
  Color local_80;
  Color local_74;
  Color local_68;
  Color local_5c;
  Color local_50;
  Color local_44;
  Color local_38;
  Color local_2c;
  Color local_20;
  Color local_14;
  
  Color::Color(&local_14,0.3,0.3,0.3);
  *(undefined8 *)(in_RDI + 0x2d0) = local_14._0_8_;
  *(float *)(in_RDI + 0x2d8) = local_14.b;
  Color::Color(&local_20,0.6,0.6,0.6);
  *(undefined8 *)(in_RDI + 0x308) = local_20._0_8_;
  *(float *)(in_RDI + 0x310) = local_20.b;
  Color::Color(&local_2c,1.0,1.0,1.0);
  *(undefined8 *)(in_RDI + 0x340) = local_2c._0_8_;
  *(float *)(in_RDI + 0x348) = local_2c.b;
  Color::Color(&local_38,0.3,0.3,0.3);
  *(undefined8 *)(in_RDI + 0x2f4) = local_38._0_8_;
  *(float *)(in_RDI + 0x2fc) = local_38.b;
  Color::Color(&local_44,0.6,0.6,0.6);
  *(undefined8 *)(in_RDI + 0x32c) = local_44._0_8_;
  *(float *)(in_RDI + 0x334) = local_44.b;
  Color::Color(&local_50,1.0,1.0,1.0);
  *(undefined8 *)(in_RDI + 0x364) = local_50._0_8_;
  *(float *)(in_RDI + 0x36c) = local_50.b;
  Color::Color(&local_5c,0.3,0.3,0.3);
  *(undefined8 *)(in_RDI + 0x2e8) = local_5c._0_8_;
  *(float *)(in_RDI + 0x2f0) = local_5c.b;
  Color::Color(&local_68,0.6,0.6,0.6);
  *(undefined8 *)(in_RDI + 800) = local_68._0_8_;
  *(float *)(in_RDI + 0x328) = local_68.b;
  Color::Color(&local_74,1.0,1.0,1.0);
  *(undefined8 *)(in_RDI + 0x358) = local_74._0_8_;
  *(float *)(in_RDI + 0x360) = local_74.b;
  Color::Color(&local_80,0.3,0.3,0.3);
  *(undefined8 *)(in_RDI + 0x2dc) = local_80._0_8_;
  *(float *)(in_RDI + 0x2e4) = local_80.b;
  Color::Color(&local_8c,0.6,0.6,0.6);
  *(undefined8 *)(in_RDI + 0x314) = local_8c._0_8_;
  *(float *)(in_RDI + 0x31c) = local_8c.b;
  Color::Color(&local_98,1.0,1.0,1.0);
  *(undefined8 *)(in_RDI + 0x34c) = local_98._0_8_;
  *(float *)(in_RDI + 0x354) = local_98.b;
  *(undefined4 *)(in_RDI + 0x300) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x338) = 0x40000000;
  *(undefined4 *)(in_RDI + 0x370) = 0x40000000;
  *(undefined4 *)(in_RDI + 0x304) = 0x40800000;
  *(undefined4 *)(in_RDI + 0x33c) = 0x41000000;
  *(undefined4 *)(in_RDI + 0x374) = 0x41000000;
  return;
}

Assistant:

void Application::initialize_style() {
  // Colors.
  defaultStyle.halfedgeColor = Color( 0.3, 0.3, 0.3);
    hoverStyle.halfedgeColor = Color( 0.6, 0.6, 0.6);
   selectStyle.halfedgeColor = Color( 1.0, 1.0, 1.0);

  defaultStyle.faceColor = Color( 0.3, 0.3, 0.3);
    hoverStyle.faceColor = Color( 0.6, 0.6, 0.6);
   selectStyle.faceColor = Color( 1.0, 1.0, 1.0);

  defaultStyle.edgeColor = Color( 0.3, 0.3, 0.3);
    hoverStyle.edgeColor = Color( 0.6, 0.6, 0.6);
   selectStyle.edgeColor = Color( 1.0, 1.0, 1.0);

  defaultStyle.vertexColor = Color( 0.3, 0.3, 0.3);
    hoverStyle.vertexColor = Color( 0.6, 0.6, 0.6);
   selectStyle.vertexColor = Color( 1.0, 1.0, 1.0);

  // Primitive sizes.
  defaultStyle.strokeWidth = 1.0;
    hoverStyle.strokeWidth = 2.0;
   selectStyle.strokeWidth = 2.0;

  defaultStyle.vertexRadius = 4.0;
    hoverStyle.vertexRadius = 8.0;
   selectStyle.vertexRadius = 8.0;
}